

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmmd.cpp
# Opt level: O2

void __thiscall image_match::rgb2hmmd_pixel_inplace(image_match *this,pixel p)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  reference puVar6;
  uchar uVar7;
  ulong pos;
  uchar uVar8;
  short sVar9;
  int iVar10;
  index_type pos_00;
  pixel p_local;
  
  p_local.last_ = p.first_;
  uVar7 = '\0';
  p_local.first_ = (pointer)this;
  pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,0);
  bVar1 = *pbVar5;
  pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,1);
  bVar2 = *pbVar5;
  pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,(ulong)(bVar2 <= bVar1));
  bVar3 = *pbVar5;
  pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,2);
  pos = (ulong)(bVar2 <= bVar1);
  if (*pbVar5 <= bVar3) {
    pos = 2;
  }
  pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,pos);
  bVar1 = *pbVar5;
  pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,0);
  bVar2 = *pbVar5;
  pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,1);
  bVar3 = *pbVar5;
  pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,(ulong)(bVar2 <= bVar3));
  bVar4 = *pbVar5;
  pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,2);
  pos_00 = 2;
  if (*pbVar5 < bVar4) {
    pos_00 = (ulong)(bVar2 <= bVar3);
  }
  pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,pos_00);
  bVar2 = *pbVar5;
  iVar10 = (uint)bVar2 - (uint)bVar1;
  uVar8 = (uchar)iVar10;
  if (uVar8 != '\0') {
    pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,0);
    bVar3 = *pbVar5;
    pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,1);
    bVar4 = *pbVar5;
    sVar9 = (short)iVar10;
    if (bVar2 == bVar3) {
      pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,2);
      uVar7 = (uchar)((short)(((ushort)bVar4 - (ushort)*pbVar5) * 0x2b) / sVar9);
    }
    else if (bVar2 == bVar4) {
      pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,2);
      bVar3 = *pbVar5;
      pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,0);
      uVar7 = (char)((short)(((ushort)bVar3 - (ushort)*pbVar5) * 0x2b) / sVar9) + 'U';
    }
    else {
      pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,0);
      bVar3 = *pbVar5;
      pbVar5 = gsl::span<unsigned_char>::operator[](&p_local,1);
      uVar7 = (char)((short)(((ushort)bVar3 - (ushort)*pbVar5) * 0x2b) / sVar9) + 0xab;
    }
  }
  puVar6 = gsl::span<unsigned_char>::operator[](&p_local,0);
  *puVar6 = uVar7;
  puVar6 = gsl::span<unsigned_char>::operator[](&p_local,1);
  *puVar6 = (uchar)((uint)bVar2 + (uint)bVar1 >> 1);
  puVar6 = gsl::span<unsigned_char>::operator[](&p_local,2);
  *puVar6 = uVar8;
  return;
}

Assistant:

void
rgb2hmmd_pixel_inplace(pixel p)
{
    pixel::value_type min, max;

    min =
      p[0] < p[1] ? (p[0] < p[2] ? p[0] : p[2]) : (p[1] < p[2] ? p[1] : p[2]);
    max =
      p[0] > p[1] ? (p[0] > p[2] ? p[0] : p[2]) : (p[1] > p[2] ? p[1] : p[2]);

    pixel::value_type sum, diff, hue;
    diff = max - min;
    sum = static_cast<pixel::value_type>(
      (static_cast<int>(max) + static_cast<int>(min)) >> 1);
    hue = 0;

    // Hue is defined same as in HSV
    if (diff) {
        if (max == p[0])
            hue = 43 * (p[1] - p[2]) / (max - min);
        else if (max == p[1])
            hue = 85 + 43 * (p[2] - p[0]) / (max - min);
        else
            hue = 171 + 43 * (p[0] - p[1]) / (max - min);
    }

    p[0] = hue;
    p[1] = sum;
    p[2] = diff;
}